

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_1UL>::
         Construct(DB *db,LIST *params)

{
  unique_ptr<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>_>
  params_00;
  IfcStructuralPlanarAction *this;
  type in;
  pointer pIVar1;
  Object *local_70;
  size_t num_args;
  unique_ptr<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>_>
  local_20;
  unique_ptr<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>_>
  impl;
  LIST *params_local;
  DB *db_local;
  
  impl._M_t.
  super___uniq_ptr_impl<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction_*,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>_>
  .super__Head_base<0UL,_Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>,_true,_true>
        )(__uniq_ptr_data<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>,_true,_true>
          )params;
  this = (IfcStructuralPlanarAction *)operator_new(0x1c0);
  Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction::IfcStructuralPlanarAction(this);
  std::
  unique_ptr<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>>
  ::unique_ptr<std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>,void>
            ((unique_ptr<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>>
              *)&local_20,this);
  params_00 = impl;
  in = std::
       unique_ptr<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>_>
       ::operator*(&local_20);
  GenericFill<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>
            (db,(LIST *)params_00._M_t.
                        super___uniq_ptr_impl<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction_*,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>_>
                        .
                        super__Head_base<0UL,_Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction_*,_false>
                        ._M_head_impl,in);
  pIVar1 = std::
           unique_ptr<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>_>
           ::release(&local_20);
  local_70 = (Object *)0x0;
  if (pIVar1 != (pointer)0x0) {
    local_70 = (Object *)
               (&(pIVar1->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
                 super_IfcObject.field_0x0 +
               *(long *)(*(long *)&(pIVar1->super_IfcStructuralAction).super_IfcStructuralActivity.
                                   super_IfcProduct.super_IfcObject + -0x18));
  }
  std::
  unique_ptr<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction,_std::default_delete<Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction>_>
  ::~unique_ptr(&local_20);
  return local_70;
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }